

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O1

void priest_talk(monst *priest)

{
  char cVar1;
  aligntyp aVar2;
  int iVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  
  iVar5 = u.ualign.record;
  aVar2 = u.ualign.type;
  cVar1 = priest->field_0x74;
  u.uconduct.gnostic = u.uconduct.gnostic + 1;
  if (((*(uint *)&priest->field_0x60 >> 0x10 & 1) == 0) &&
     (-1 < u.ualign.record ||
      ((*(uint *)&priest->field_0x60 >> 0x1c & 1) != 0 || u.ualign.type != cVar1))) {
    bVar4 = histemple_at(priest,priest->mx,priest->my);
    if ((bVar4 == '\0') || ((*(uint *)&priest->field_0x60 & 0x4c0000) != 0x440000)) {
      if ((*(uint *)&priest->field_0x60 & 0xc0000) != 0x40000) {
        pcVar7 = Monnam(priest);
        iVar5 = pronoun_gender(level,priest);
        pline("%s breaks out of %s reverie!",pcVar7,genders[iVar5].his);
        priest->mfrozen = '\0';
        *(uint *)&priest->field_0x60 = *(uint *)&priest->field_0x60 & 0xfff3ffff | 0x40000;
      }
      priest->field_0x62 = priest->field_0x62 & 0xbf;
      uVar6 = mt_random();
      pcVar7 = priest_talk_cranky_msg_rel +
               *(int *)(priest_talk_cranky_msg_rel + (ulong)(uVar6 % 3) * 4);
LAB_00228ada:
      verbalize(pcVar7);
      return;
    }
    pcVar7 = in_rooms(level,priest->mx,priest->my,10);
    if ((*pcVar7 == '\0') || (bVar4 = has_shrine(priest), bVar4 != '\0')) {
      lVar8 = money_cnt(invent);
      if (lVar8 == 0) {
        if (aVar2 != cVar1 || iVar5 < 0) {
          pcVar7 = Monnam(priest);
          pline("%s is not interested.",pcVar7);
          return;
        }
        lVar8 = money_cnt(priest->minvent);
        pcVar7 = Monnam(priest);
        if (lVar8 < 1) {
          pline("%s preaches the virtues of poverty.",pcVar7);
        }
        else {
          pcVar10 = "two bits";
          if (lVar8 == 1) {
            pcVar10 = "one bit";
          }
          pline("%s gives you %s for an ale.",pcVar7,pcVar10);
          money2u(priest,(ulong)(lVar8 != 1) + 1);
        }
      }
      else {
        pcVar7 = Monnam(priest);
        pline("%s asks you for a contribution for the temple.",pcVar7);
        lVar8 = bribe(priest);
        iVar3 = u.ublessed;
        if (lVar8 == 0) {
          verbalize("Thou shalt regret thine action!");
          if (aVar2 != cVar1) {
            return;
          }
          iVar5 = -1;
LAB_00228b59:
          adjalign(iVar5);
          return;
        }
        lVar9 = (long)u.ulevel;
        if (SBORROW8(lVar8,lVar9 * 200) == lVar8 + lVar9 * -200 < 0) {
          if (SBORROW8(lVar8,lVar9 * 400) != lVar8 + lVar9 * -400 < 0) {
            verbalize("Thou art indeed a pious individual.");
            lVar9 = money_cnt(invent);
            if (SBORROW8(lVar9,lVar8 * 2) == lVar9 + lVar8 * -2 < 0) {
              return;
            }
            if ((aVar2 == cVar1) && (u.ualign.record < -3)) {
              adjalign(1);
            }
            verbalize("I bestow upon thee a blessing.");
            uVar6 = mt_random();
            incr_itimeout(&u.uprops[0x2e].intrinsic,(ulong)(uVar6 % 500 + 500));
            return;
          }
          if ((u.ublessed < 0x14 && lVar8 < u.ulevel * 600) &&
             ((u.ublessed < 9 || (uVar6 = mt_random(), uVar6 % (uint)iVar3 == 0)))) {
            verbalize("Thy devotion has been rewarded.");
            if ((u.uprops[0x16].intrinsic & 0x7000000) == 0) {
              u.uprops[0x16].intrinsic = u.uprops[0x16].intrinsic | 0x4000000;
              if (u.ublessed == 0) {
                uVar6 = mt_random();
                u.ublessed = uVar6 % 3 + 2;
              }
            }
            else {
              u.ublessed = u.ublessed + 1;
            }
          }
          else {
            verbalize("Thy selfless generosity is deeply appreciated.");
            lVar9 = money_cnt(invent);
            if (SBORROW8(lVar9,lVar8 * 2) != lVar9 + lVar8 * -2 < 0 && aVar2 == cVar1) {
              if ((iVar5 < 0) && (5000 < moves - u.ucleansed)) {
                u.ualign.record = 0;
                u.ucleansed = moves;
                return;
              }
              iVar5 = 2;
              goto LAB_00228b59;
            }
          }
          return;
        }
        lVar9 = money_cnt(invent);
        if (lVar9 != lVar8 * 2 && SBORROW8(lVar9,lVar8 * 2) == lVar9 + lVar8 * -2 < 0) {
          pcVar7 = "Cheapskate.";
          goto LAB_00228ada;
        }
        verbalize("I thank thee for thy contribution.");
      }
      exercise(2,'\x01');
      return;
    }
    verbalize("Begone!  Thou desecratest this holy place with thy presence.");
  }
  else {
    pcVar7 = Monnam(priest);
    pline("%s doesn\'t want anything to do with you!",pcVar7);
  }
  priest->field_0x62 = priest->field_0x62 & 0xbf;
  return;
}

Assistant:

void priest_talk(struct monst *priest)
{
	boolean coaligned = p_coaligned(priest);
	boolean strayed = (u.ualign.record < 0);

	/* KMH, conduct */
	u.uconduct.gnostic++;

	if (priest->mflee || (!priest->ispriest && coaligned && strayed)) {
	    pline("%s doesn't want anything to do with you!",
				Monnam(priest));
	    priest->mpeaceful = 0;
	    return;
	}

	/* priests don't chat unless peaceful and in their own temple */
	if (!histemple_at(priest,priest->mx,priest->my) ||
		 !priest->mpeaceful || !priest->mcanmove || priest->msleeping) {
	    static const char *const cranky_msg[3] = {
		"Thou wouldst have words, eh?  I'll give thee a word or two!",
		"Talk?  Here is what I have to say!",
		"Pilgrim, I would speak no longer with thee."
	    };

	    if (!priest->mcanmove || priest->msleeping) {
		pline("%s breaks out of %s reverie!",
		      Monnam(priest), mhis(level, priest));
		priest->mfrozen = priest->msleeping = 0;
		priest->mcanmove = 1;
	    }
	    priest->mpeaceful = 0;
	    verbalize(cranky_msg[rn2(3)]);
	    return;
	}

	/* you desecrated the temple and now you want to chat? */
	if (priest->mpeaceful && *in_rooms(level, priest->mx, priest->my, TEMPLE) &&
		  !has_shrine(priest)) {
	    verbalize("Begone!  Thou desecratest this holy place with thy presence.");
	    priest->mpeaceful = 0;
	    return;
	}
	if (!money_cnt(invent)) {
	    if (coaligned && !strayed) {
                long pmoney = money_cnt(priest->minvent);
		if (pmoney > 0L) {
		    /* Note: two bits is actually 25 cents.  Hmm. */
		    pline("%s gives you %s for an ale.", Monnam(priest),
			(pmoney == 1L) ? "one bit" : "two bits");
		     money2u(priest, pmoney > 1L ? 2 : 1);
		} else
		    pline("%s preaches the virtues of poverty.", Monnam(priest));
		exercise(A_WIS, TRUE);
	    } else
		pline("%s is not interested.", Monnam(priest));
	    return;
	} else {
	    long offer;

	    pline("%s asks you for a contribution for the temple.",
			Monnam(priest));
	    if ((offer = bribe(priest)) == 0) {
		verbalize("Thou shalt regret thine action!");
		if (coaligned) adjalign(-1);
	    } else if (offer < (u.ulevel * 200)) {
		if (money_cnt(invent) > (offer * 2L)) verbalize("Cheapskate.");
		else {
		    verbalize("I thank thee for thy contribution.");
		    /*  give player some token  */
		    exercise(A_WIS, TRUE);
		}
	    } else if (offer < (u.ulevel * 400)) {
		verbalize("Thou art indeed a pious individual.");
		if (money_cnt(invent) < (offer * 2L)) {
		    if (coaligned && u.ualign.record <= ALGN_SINNED)
			adjalign(1);
		    verbalize("I bestow upon thee a blessing.");
		    incr_itimeout(&HClairvoyant, rn1(500,500));
		}
	    } else if (offer < (u.ulevel * 600) &&
		      u.ublessed < 20 &&
		      (u.ublessed < 9 || !rn2(u.ublessed))) {
		verbalize("Thy devotion has been rewarded.");
		if (!(HProtection & INTRINSIC))  {
			HProtection |= FROMOUTSIDE;
			if (!u.ublessed)  u.ublessed = rn1(3, 2);
		} else u.ublessed++;
	    } else {
		verbalize("Thy selfless generosity is deeply appreciated.");
		if (money_cnt(invent) < (offer * 2L) && coaligned) {
		    if (strayed && (moves - u.ucleansed) > 5000L) {
			u.ualign.record = 0; /* cleanse thee */
			u.ucleansed = moves;
		    } else {
			adjalign(2);
		    }
		}
	    }
	}
}